

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.h
# Opt level: O0

void __thiscall
HighsImplications::HighsImplications(HighsImplications *this,HighsMipSolver *mipsolver)

{
  HighsInt HVar1;
  HighsMipSolver *in_RSI;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  *in_RDI;
  HighsInt numcol;
  function<void_(int,_int,_int,_double)> *this_00;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  *__new_size;
  
  std::vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>::vector
            ((vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_> *)
             0x619966);
  this_00 = (function<void_(int,_int,_int,_double)> *)
            &(((_Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
                *)&in_RDI[1].
                   super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
              )->_M_impl).super__Vector_impl_data._M_end_of_storage;
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::vector((vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
            *)0x619979);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::vector((vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
            *)0x61998c);
  (((_Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_> *)
   &in_RDI[3].
    super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
   )->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)in_RSI;
  std::vector<HighsSubstitution,_std::allocator<HighsSubstitution>_>::vector
            ((vector<HighsSubstitution,_std::allocator<HighsSubstitution>_> *)0x6199a8);
  __new_size = in_RDI + 5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x6199bb);
  std::function<void_(int,_int,_int,_double)>::function(this_00);
  HighsMipSolver::numCol(in_RSI);
  std::vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>::resize
            ((vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_> *)
             in_RDI,(size_type)__new_size);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,(size_type)__new_size);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::resize(in_RDI,(size_type)__new_size);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::resize(in_RDI,(size_type)__new_size);
  HVar1 = HighsMipSolver::numNonzero((HighsMipSolver *)0x619a3c);
  *(HighsInt *)
   &(in_RDI->
    super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
    )._M_impl.super__Vector_impl_data._M_start = HVar1;
  in_RDI[1].
  super__Vector_base<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

HighsImplications(const HighsMipSolver& mipsolver) : mipsolver(mipsolver) {
    HighsInt numcol = mipsolver.numCol();
    implications.resize(2 * static_cast<size_t>(numcol));
    colsubstituted.resize(numcol);
    vubs.resize(numcol);
    vlbs.resize(numcol);
    nextCleanupCall = mipsolver.numNonzero();
    numImplications = 0;
  }